

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>,duckdb::hugeint_t,long,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (hugeint_t *adata,AggregateInputData *aggr_input_data,long *bdata,
               ArgMinMaxState<duckdb::hugeint_t,_long> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  ArgMinMaxState<duckdb::hugeint_t,_long> *pAVar6;
  long lVar7;
  int64_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  hugeint_t *phVar13;
  idx_t iVar14;
  ulong uVar15;
  idx_t iVar16;
  idx_t iVar17;
  
  puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar2 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0 && puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = asel->sel_vector;
      psVar4 = bsel->sel_vector;
      psVar5 = ssel->sel_vector;
      uVar11 = 0;
      do {
        uVar12 = uVar11;
        if (psVar3 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar3[uVar11];
        }
        uVar9 = uVar11;
        if (psVar4 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar4[uVar11];
        }
        uVar15 = uVar11;
        if (psVar5 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar5[uVar11];
        }
        pAVar6 = states[uVar15];
        phVar13 = adata + uVar12;
        if ((pAVar6->super_ArgMinMaxStateBase).is_initialized == false) {
          iVar8 = phVar13->upper;
          (pAVar6->arg).lower = phVar13->lower;
          (pAVar6->arg).upper = iVar8;
          pAVar6->value = bdata[uVar9];
          (pAVar6->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          lVar7 = bdata[uVar9];
          if (lVar7 < pAVar6->value) {
            iVar8 = phVar13->upper;
            (pAVar6->arg).lower = phVar13->lower;
            (pAVar6->arg).upper = iVar8;
            pAVar6->value = lVar7;
          }
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (count != 0) {
    psVar3 = asel->sel_vector;
    psVar4 = bsel->sel_vector;
    psVar5 = ssel->sel_vector;
    iVar10 = 0;
    do {
      iVar16 = iVar10;
      if (psVar3 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar3[iVar10];
      }
      iVar17 = iVar10;
      if (psVar4 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar4[iVar10];
      }
      iVar14 = iVar10;
      if (psVar5 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar5[iVar10];
      }
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0))
         && ((puVar2 == (unsigned_long *)0x0 || ((puVar2[iVar17 >> 6] >> (iVar17 & 0x3f) & 1) != 0))
            )) {
        pAVar6 = states[iVar14];
        phVar13 = adata + iVar16;
        if ((pAVar6->super_ArgMinMaxStateBase).is_initialized == false) {
          iVar8 = phVar13->upper;
          (pAVar6->arg).lower = phVar13->lower;
          (pAVar6->arg).upper = iVar8;
          pAVar6->value = bdata[iVar17];
          (pAVar6->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          lVar7 = bdata[iVar17];
          if (lVar7 < pAVar6->value) {
            iVar8 = phVar13->upper;
            (pAVar6->arg).lower = phVar13->lower;
            (pAVar6->arg).upper = iVar8;
            pAVar6->value = lVar7;
          }
        }
      }
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}